

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O2

void __thiscall QAbstractButton::mouseReleaseEvent(QAbstractButton *this,QMouseEvent *e)

{
  byte bVar1;
  QAbstractButtonPrivate *this_00;
  char cVar2;
  QMouseEvent QVar3;
  long in_FS_OFFSET;
  QPointF local_40;
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(e + 0x40) == 1) {
    this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8;
    bVar1 = this_00->field_0x28c;
    this_00->field_0x28c = bVar1 & 0xbf;
    if ((bVar1 & 0x10) != 0) {
      local_40 = QSinglePointEvent::position((QSinglePointEvent *)e);
      local_30 = QPointF::toPoint(&local_40);
      cVar2 = (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this);
      if (cVar2 == '\0') {
        QVar3 = (QMouseEvent)0x0;
        setDown(this,false);
      }
      else {
        QBasicTimer::stop();
        QAbstractButtonPrivate::click(this_00);
        QVar3 = (QMouseEvent)0x1;
      }
      goto LAB_0039c32f;
    }
    QAbstractButtonPrivate::refresh(this_00);
  }
  QVar3 = (QMouseEvent)0x0;
LAB_0039c32f:
  e[0xc] = QVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QAbstractButton);

    if (e->button() != Qt::LeftButton) {
        e->ignore();
        return;
    }

    d->pressed = false;

    if (!d->down) {
        // refresh is required by QMacStyle to resume the default button animation
        d->refresh();
        e->ignore();
        return;
    }

    if (hitButton(e->position().toPoint())) {
        d->repeatTimer.stop();
        d->click();
        e->accept();
    } else {
        setDown(false);
        e->ignore();
    }
}